

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

uint32_t pkt_buf_alloc_batch(mempool *mempool,pkt_buf **bufs,uint32_t num_bufs)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = mempool->free_stack_top;
  uVar2 = (ulong)num_bufs;
  if (uVar3 < num_bufs) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
            "pkt_buf_alloc_batch",mempool,(ulong)uVar3,uVar2);
    uVar3 = mempool->free_stack_top;
    uVar2 = (ulong)uVar3;
  }
  for (uVar1 = 0; uVar3 = uVar3 - 1, uVar2 != uVar1; uVar1 = uVar1 + 1) {
    mempool->free_stack_top = uVar3;
    bufs[uVar1] = (pkt_buf *)
                  ((ulong)(mempool->buf_size * *(int *)(&mempool->field_0x14 + (ulong)uVar3 * 4)) +
                  (long)mempool->base_addr);
  }
  return (uint32_t)uVar2;
}

Assistant:

uint32_t pkt_buf_alloc_batch(struct mempool* mempool, struct pkt_buf* bufs[], uint32_t num_bufs) {
	if (mempool->free_stack_top < num_bufs) {
		warn("memory pool %p only has %d free bufs, requested %d", mempool, mempool->free_stack_top, num_bufs);
		num_bufs = mempool->free_stack_top;
	}
	for (uint32_t i = 0; i < num_bufs; i++) {
		uint32_t entry_id = mempool->free_stack[--mempool->free_stack_top];
		bufs[i] = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + entry_id * mempool->buf_size);
	}
	return num_bufs;
}